

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_serialize.c
# Opt level: O3

int32_t pcre2_serialize_decode_16
                  (pcre2_code_16 **codes,int32_t number_of_codes,uint8_t *bytes,
                  pcre2_general_context_16 *gcontext)

{
  byte *pbVar1;
  uint uVar2;
  uint8_t *__dest;
  pcre2_code_16 *ppVar3;
  ulong uVar4;
  pcre2_compile_context_16 *ppVar5;
  uint uVar6;
  uint8_t *puVar7;
  ulong uVar8;
  
  ppVar5 = (pcre2_compile_context_16 *)gcontext;
  if (gcontext == (pcre2_general_context_16 *)0x0) {
    ppVar5 = &_pcre2_default_compile_context_16;
  }
  uVar6 = 0xffffffcd;
  if (codes != (pcre2_code_16 **)0x0 && bytes != (uint8_t *)0x0) {
    if (number_of_codes < 1) {
      uVar6 = 0xffffffe3;
    }
    else {
      uVar2 = *(uint *)(bytes + 0xc);
      if ((int)uVar2 < 1) {
LAB_0015c8a1:
        uVar6 = 0xffffffc2;
      }
      else {
        uVar6 = 0xffffffe1;
        if (((*(int *)bytes == 0x50523253) && (uVar6 = 0xffffffe0, *(int *)(bytes + 4) == 0x20000a))
           && (*(int *)(bytes + 8) == 0x80802)) {
          if (uVar2 < (uint)number_of_codes) {
            number_of_codes = uVar2;
          }
          __dest = (uint8_t *)(*(ppVar5->memctl).malloc)(0x448,(ppVar5->memctl).memory_data);
          uVar6 = 0xffffffd0;
          if (__dest != (uint8_t *)0x0) {
            memcpy(__dest,bytes + 0x10,0x440);
            *(ulong *)(__dest + 0x440) = (ulong)(uint)number_of_codes;
            puVar7 = bytes + 0x450;
            uVar4 = 0;
            do {
              uVar8 = *(ulong *)(puVar7 + 0x48);
              if (uVar8 < 0x89) goto LAB_0015c8a1;
              ppVar3 = (pcre2_code_16 *)_pcre2_memctl_malloc_16(uVar8,&gcontext->memctl);
              if (ppVar3 == (pcre2_code_16 *)0x0) {
                (*(ppVar5->memctl).free)(__dest,(ppVar5->memctl).memory_data);
                if (uVar4 == 0) {
                  return -0x30;
                }
                uVar8 = 0;
                do {
                  (*(ppVar5->memctl).free)(codes[uVar8],(ppVar5->memctl).memory_data);
                  codes[uVar8] = (pcre2_code_16 *)0x0;
                  uVar8 = uVar8 + 1;
                } while (uVar4 != uVar8);
                return -0x30;
              }
              memcpy(&ppVar3->tables,puVar7 + 0x18,uVar8 - 0x18);
              if (((ppVar3->magic_number != 0x50435245) || (0x22 < ppVar3->name_entry_size)) ||
                 (10000 < ppVar3->name_count)) {
                (*(ppVar5->memctl).free)(ppVar3,(ppVar5->memctl).memory_data);
                goto LAB_0015c8a1;
              }
              ppVar3->tables = __dest;
              ppVar3->executable_jit = (void *)0x0;
              pbVar1 = (byte *)((long)&ppVar3->flags + 2);
              *pbVar1 = *pbVar1 | 4;
              codes[uVar4] = ppVar3;
              puVar7 = puVar7 + uVar8;
              uVar4 = uVar4 + 1;
              uVar6 = number_of_codes;
            } while ((uint)number_of_codes != uVar4);
          }
        }
      }
    }
  }
  return uVar6;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_serialize_decode(pcre2_code **codes, int32_t number_of_codes,
   const uint8_t *bytes, pcre2_general_context *gcontext)
{
const pcre2_serialized_data *data = (const pcre2_serialized_data *)bytes;
const pcre2_memctl *memctl = (gcontext != NULL) ?
  &gcontext->memctl : &PRIV(default_compile_context).memctl;

const uint8_t *src_bytes;
pcre2_real_code *dst_re;
uint8_t *tables;
int32_t i, j;

/* Sanity checks. */

if (data == NULL || codes == NULL) return PCRE2_ERROR_NULL;
if (number_of_codes <= 0) return PCRE2_ERROR_BADDATA;
if (data->number_of_codes <= 0) return PCRE2_ERROR_BADSERIALIZEDDATA;
if (data->magic != SERIALIZED_DATA_MAGIC) return PCRE2_ERROR_BADMAGIC;
if (data->version != SERIALIZED_DATA_VERSION) return PCRE2_ERROR_BADMODE;
if (data->config != SERIALIZED_DATA_CONFIG) return PCRE2_ERROR_BADMODE;

if (number_of_codes > data->number_of_codes)
  number_of_codes = data->number_of_codes;

src_bytes = bytes + sizeof(pcre2_serialized_data);

/* Decode tables. The reference count for the tables is stored immediately
following them. */

tables = memctl->malloc(tables_length + sizeof(PCRE2_SIZE), memctl->memory_data);
if (tables == NULL) return PCRE2_ERROR_NOMEMORY;

memcpy(tables, src_bytes, tables_length);
*(PCRE2_SIZE *)(tables + tables_length) = number_of_codes;
src_bytes += tables_length;

/* Decode the byte stream. We must not try to read the size from the compiled
code block in the stream, because it might be unaligned, which causes errors on
hardware such as Sparc-64 that doesn't like unaligned memory accesses. The type
of the blocksize field is given its own name to ensure that it is the same here
as in the block. */

for (i = 0; i < number_of_codes; i++)
  {
  CODE_BLOCKSIZE_TYPE blocksize;
  memcpy(&blocksize, src_bytes + offsetof(pcre2_real_code, blocksize),
    sizeof(CODE_BLOCKSIZE_TYPE));
  if (blocksize <= sizeof(pcre2_real_code))
    return PCRE2_ERROR_BADSERIALIZEDDATA;

  /* The allocator provided by gcontext replaces the original one. */

  dst_re = (pcre2_real_code *)PRIV(memctl_malloc)(blocksize,
    (pcre2_memctl *)gcontext);
  if (dst_re == NULL)
    {
    memctl->free(tables, memctl->memory_data);
    for (j = 0; j < i; j++)
      {
      memctl->free(codes[j], memctl->memory_data);
      codes[j] = NULL;
      }
    return PCRE2_ERROR_NOMEMORY;
    }

  /* The new allocator must be preserved. */

  memcpy(((uint8_t *)dst_re) + sizeof(pcre2_memctl),
    src_bytes + sizeof(pcre2_memctl), blocksize - sizeof(pcre2_memctl));
  if (dst_re->magic_number != MAGIC_NUMBER ||
      dst_re->name_entry_size > MAX_NAME_SIZE + IMM2_SIZE + 1 ||
      dst_re->name_count > MAX_NAME_COUNT)
    {   
    memctl->free(dst_re, memctl->memory_data); 
    return PCRE2_ERROR_BADSERIALIZEDDATA;
    } 

  /* At the moment only one table is supported. */

  dst_re->tables = tables;
  dst_re->executable_jit = NULL;
  dst_re->flags |= PCRE2_DEREF_TABLES;

  codes[i] = dst_re;
  src_bytes += blocksize;
  }

return number_of_codes;
}